

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonTests.cc
# Opt level: O1

void avro::json::testObject2(void)

{
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>_>_>
  *this;
  long lVar1;
  element_type *peVar2;
  element_type *peVar3;
  int iVar4;
  shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>_>_>_>
  *psVar5;
  const_iterator cVar6;
  long *plVar7;
  shared_ptr<std::vector<avro::json::Entity,_std::allocator<avro::json::Entity>_>_> *psVar8;
  shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *psVar9;
  char *local_140;
  element_type *local_138;
  undefined8 local_130;
  undefined1 local_128 [8];
  undefined1 local_120 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_110;
  assertion_result local_100;
  char **local_e8;
  _func_int **local_e0;
  assertion_result local_d8;
  undefined1 local_c0 [16];
  undefined8 *local_b0;
  char *local_a8;
  undefined **local_a0;
  const_string local_98;
  Entity n;
  any local_80;
  undefined **local_78;
  undefined **local_70;
  undefined **local_68;
  undefined **local_60;
  _Base_ptr local_58;
  const_string local_50;
  const_string local_40;
  
  avro::json::loadEntity((char *)&n);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1c39f0,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1a23dd);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x9e;
  local_c0._8_8_ = local_c0._8_8_ & 0xffffffffffffff00;
  local_e0 = (_func_int **)&PTR__lazy_ostream_001c0950;
  local_c0._0_8_ = &PTR__lazy_ostream_001c0950;
  local_b0 = &boost::unit_test::lazy_ostream::inst;
  local_a8 = "";
  local_138 = (element_type *)local_128;
  local_128._0_4_ = _n;
  local_140 = (char *)&local_130;
  local_130._0_4_ = 6;
  local_d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(_n == 6);
  local_d8.m_message.px = (element_type *)0x0;
  local_d8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_98.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
  ;
  local_98.m_end = "";
  local_110._8_8_ = &local_138;
  local_120[8] = '\0';
  local_120._0_8_ = &PTR__lazy_ostream_001c0990;
  local_110._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_100.m_message.px = (element_type *)((ulong)local_100.m_message.px & 0xffffffffffffff00);
  local_e8 = &local_140;
  local_a0 = &PTR__lazy_ostream_001c0990;
  local_100._0_8_ = &PTR__lazy_ostream_001c0990;
  local_100.m_message.pn.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion
            (&local_d8,(lazy_ostream *)local_c0,&local_98,0x9e,CHECK,CHECK_EQUAL,2,"n.type()",
             local_120,"etObject",&local_100);
  boost::detail::shared_count::~shared_count(&local_d8.m_message.pn);
  avro::json::Entity::ensureType((EntityType)&n);
  psVar5 = boost::
           any_cast<boost::shared_ptr<std::map<std::__cxx11::string,avro::json::Entity,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,avro::json::Entity>>>>>
                     (&local_80);
  this = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>_>_>
          *)psVar5->px;
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1c39f0,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1a23dd);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0xa0;
  local_c0._8_8_ = local_c0._8_8_ & 0xffffffffffffff00;
  local_c0._0_8_ = local_e0;
  local_b0 = &boost::unit_test::lazy_ostream::inst;
  local_a8 = "";
  local_128 = *(undefined1 (*) [8])(this + 0x28);
  local_d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_128 == (undefined1  [8])0x2);
  local_130 = CONCAT44(local_130._4_4_,2);
  local_d8.m_message.px = (element_type *)0x0;
  local_d8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_98.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
  ;
  local_98.m_end = "";
  local_138 = (element_type *)local_128;
  local_120[8] = '\0';
  local_68 = &PTR__lazy_ostream_001bfe38;
  local_120._0_8_ = &PTR__lazy_ostream_001bfe38;
  local_110._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_110._8_8_ = &local_138;
  local_140 = (char *)&local_130;
  local_100.m_message.px = (element_type *)((ulong)local_100.m_message.px & 0xffffffffffffff00);
  local_60 = &PTR__lazy_ostream_001bfe78;
  local_100._0_8_ = &PTR__lazy_ostream_001bfe78;
  local_100.m_message.pn.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_e8 = &local_140;
  boost::test_tools::tt_detail::report_assertion
            (&local_d8,(lazy_ostream *)local_c0,&local_98,0xa0,CHECK,CHECK_EQUAL,2,"m.size()",
             local_120,"2",&local_100);
  boost::detail::shared_count::~shared_count(&local_d8.m_message.pn);
  local_120._0_8_ = &local_110;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_120,"k1","");
  cVar6 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>_>_>
          ::find(this,(key_type *)local_120);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._0_8_ != &local_110) {
    operator_delete((void *)local_120._0_8_,local_110._M_allocated_capacity + 1);
  }
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1c39f0,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1a23dd);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0xa3;
  local_58 = (_Base_ptr)(this + 8);
  local_100.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(cVar6._M_node != local_58);
  local_100.m_message.px = (element_type *)0x0;
  local_100.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_c0._0_8_ = "it != m.end()";
  local_c0._8_8_ = "";
  local_120[8] = '\0';
  local_120._0_8_ = &PTR__lazy_ostream_001bfff8;
  local_110._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_40.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
  ;
  local_40.m_end = "";
  local_110._8_8_ = (lazy_ostream *)local_c0;
  boost::test_tools::tt_detail::report_assertion
            (&local_100,(lazy_ostream *)local_120,&local_40,0xa3,CHECK,CHECK_PRED,0);
  boost::detail::shared_count::~shared_count(&local_100.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1c39f0,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1a23dd);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0xa4;
  local_c0._8_8_ = local_c0._8_8_ & 0xffffffffffffff00;
  local_c0._0_8_ = local_e0;
  local_b0 = &boost::unit_test::lazy_ostream::inst;
  local_a8 = "";
  local_128._0_4_ = cVar6._M_node[2]._M_color;
  local_d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(cVar6._M_node[2]._M_color == 2);
  local_130 = CONCAT44(local_130._4_4_,2);
  local_d8.m_message.px = (element_type *)0x0;
  local_d8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_98.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
  ;
  local_98.m_end = "";
  local_138 = (element_type *)local_128;
  local_120[8] = '\0';
  local_120._0_8_ = local_a0;
  local_110._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_110._8_8_ = &local_138;
  local_140 = (char *)&local_130;
  local_100.m_message.px = (element_type *)((ulong)local_100.m_message.px & 0xffffffffffffff00);
  local_100._0_8_ = local_a0;
  local_100.m_message.pn.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_e8 = &local_140;
  boost::test_tools::tt_detail::report_assertion
            (&local_d8,(lazy_ostream *)local_c0,&local_98,0xa4,CHECK,CHECK_EQUAL,2,
             "it->second.type()",(lazy_ostream *)local_120,"etLong",&local_100);
  boost::detail::shared_count::~shared_count(&local_d8.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1c39f0,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1a23dd);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0xa5;
  local_c0._8_8_ = local_c0._8_8_ & 0xffffffffffffff00;
  local_c0._0_8_ = local_e0;
  local_b0 = &boost::unit_test::lazy_ostream::inst;
  local_a8 = "";
  lVar1 = *(long *)(this + 0x18);
  avro::json::Entity::ensureType((int)lVar1 + 0x40);
  plVar7 = boost::any_cast<long_const&>((any *)(lVar1 + 0x48));
  local_128 = (undefined1  [8])*plVar7;
  local_130 = 100;
  local_d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_128 == (undefined1  [8])0x64);
  local_d8.m_message.px = (element_type *)0x0;
  local_d8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_98.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
  ;
  local_98.m_end = "";
  local_138 = (element_type *)local_128;
  local_120[8] = '\0';
  local_70 = &PTR__lazy_ostream_001bfeb8;
  local_120._0_8_ = &PTR__lazy_ostream_001bfeb8;
  local_110._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_110._8_8_ = &local_138;
  local_140 = (char *)&local_130;
  local_100.m_message.px = (element_type *)((ulong)local_100.m_message.px & 0xffffffffffffff00);
  local_78 = &PTR__lazy_ostream_001bfef8;
  local_100._0_8_ = &PTR__lazy_ostream_001bfef8;
  local_100.m_message.pn.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_e8 = &local_140;
  boost::test_tools::tt_detail::report_assertion
            (&local_d8,(lazy_ostream *)local_c0,&local_98,0xa5,CHECK,CHECK_EQUAL,2,
             "m.begin()->second.longValue()",(lazy_ostream *)local_120,"100ll",&local_100);
  boost::detail::shared_count::~shared_count(&local_d8.m_message.pn);
  local_120._0_8_ = &local_110;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_120,"k2","");
  cVar6 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>_>_>
          ::find(this,(key_type *)local_120);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._0_8_ != &local_110) {
    operator_delete((void *)local_120._0_8_,local_110._M_allocated_capacity + 1);
  }
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1c39f0,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1a23dd);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0xa8;
  local_100.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(cVar6._M_node != local_58);
  local_100.m_message.px = (element_type *)0x0;
  local_100.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_c0._0_8_ = "it != m.end()";
  local_c0._8_8_ = "";
  local_120[8] = '\0';
  local_120._0_8_ = &PTR__lazy_ostream_001bfff8;
  local_110._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_50.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
  ;
  local_50.m_end = "";
  local_110._8_8_ = (lazy_ostream *)local_c0;
  boost::test_tools::tt_detail::report_assertion
            (&local_100,(lazy_ostream *)local_120,&local_50,0xa8,CHECK,CHECK_PRED,0);
  boost::detail::shared_count::~shared_count(&local_100.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1c39f0,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1a23dd);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0xa9;
  local_c0._8_8_ = local_c0._8_8_ & 0xffffffffffffff00;
  local_c0._0_8_ = local_e0;
  local_b0 = &boost::unit_test::lazy_ostream::inst;
  local_a8 = "";
  local_128._0_4_ = cVar6._M_node[2]._M_color;
  local_d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(cVar6._M_node[2]._M_color == 5);
  local_130._0_4_ = 5;
  local_d8.m_message.px = (element_type *)0x0;
  local_d8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_98.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
  ;
  local_98.m_end = "";
  local_138 = (element_type *)local_128;
  local_120[8] = '\0';
  local_120._0_8_ = local_a0;
  local_110._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_110._8_8_ = &local_138;
  local_140 = (char *)&local_130;
  local_100.m_message.px = (element_type *)((ulong)local_100.m_message.px & 0xffffffffffffff00);
  local_100._0_8_ = local_a0;
  local_100.m_message.pn.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_e8 = &local_140;
  boost::test_tools::tt_detail::report_assertion
            (&local_d8,(lazy_ostream *)local_c0,&local_98,0xa9,CHECK,CHECK_EQUAL,2,
             "it->second.type()",(lazy_ostream *)local_120,"etArray",&local_100);
  boost::detail::shared_count::~shared_count(&local_d8.m_message.pn);
  avro::json::Entity::ensureType((int)cVar6._M_node + 0x40);
  psVar8 = boost::
           any_cast<boost::shared_ptr<std::vector<avro::json::Entity,std::allocator<avro::json::Entity>>>>
                     ((any *)&cVar6._M_node[2]._M_parent);
  peVar2 = psVar8->px;
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1c39f0,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1a23dd);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0xab;
  local_c0._8_8_ = local_c0._8_8_ & 0xffffffffffffff00;
  local_c0._0_8_ = local_e0;
  local_b0 = &boost::unit_test::lazy_ostream::inst;
  local_a8 = "";
  local_128 = (undefined1  [8])(*(long *)(peVar2 + 8) - *(long *)peVar2 >> 4);
  local_d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(*(long *)(peVar2 + 8) - *(long *)peVar2 == 0x20);
  local_120[8] = '\0';
  local_120._0_8_ = local_68;
  local_130._0_4_ = 2;
  local_100.m_message.px = (element_type *)((ulong)local_100.m_message.px & 0xffffffffffffff00);
  local_d8.m_message.px = (element_type *)0x0;
  local_d8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_100._0_8_ = local_60;
  local_98.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
  ;
  local_98.m_end = "";
  local_138 = (element_type *)local_128;
  local_110._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_110._8_8_ = &local_138;
  local_140 = (char *)&local_130;
  local_100.m_message.pn.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_e8 = &local_140;
  boost::test_tools::tt_detail::report_assertion
            (&local_d8,(lazy_ostream *)local_c0,&local_98,0xab,CHECK,CHECK_EQUAL,2,"a.size()",
             (lazy_ostream *)local_120,"2",&local_100);
  boost::detail::shared_count::~shared_count(&local_d8.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1c39f0,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1a23dd);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0xac;
  local_c0._8_8_ = local_c0._8_8_ & 0xffffffffffffff00;
  local_c0._0_8_ = local_e0;
  local_b0 = &boost::unit_test::lazy_ostream::inst;
  local_a8 = "";
  local_128._0_4_ = **(int **)peVar2;
  local_d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(**(int **)peVar2 == 2);
  local_130 = CONCAT44(local_130._4_4_,2);
  local_d8.m_message.px = (element_type *)0x0;
  local_d8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_98.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
  ;
  local_98.m_end = "";
  local_138 = (element_type *)local_128;
  local_120[8] = '\0';
  local_120._0_8_ = local_a0;
  local_110._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_110._8_8_ = &local_138;
  local_140 = (char *)&local_130;
  local_100.m_message.px = (element_type *)((ulong)local_100.m_message.px & 0xffffffffffffff00);
  local_100._0_8_ = local_a0;
  local_100.m_message.pn.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_e8 = &local_140;
  boost::test_tools::tt_detail::report_assertion
            (&local_d8,(lazy_ostream *)local_c0,&local_98,0xac,CHECK,CHECK_EQUAL,2,"a[0].type()",
             (lazy_ostream *)local_120,"etLong",&local_100);
  boost::detail::shared_count::~shared_count(&local_d8.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1c39f0,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1a23dd);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0xad;
  local_c0._8_8_ = local_c0._8_8_ & 0xffffffffffffff00;
  local_c0._0_8_ = local_e0;
  local_b0 = &boost::unit_test::lazy_ostream::inst;
  local_a8 = "";
  lVar1 = *(long *)peVar2;
  avro::json::Entity::ensureType((EntityType)lVar1);
  plVar7 = boost::any_cast<long_const&>((any *)(lVar1 + 8));
  local_128 = (undefined1  [8])*plVar7;
  local_130 = 400;
  local_d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_128 == (undefined1  [8])0x190);
  local_d8.m_message.px = (element_type *)0x0;
  local_d8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_98.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
  ;
  local_98.m_end = "";
  local_138 = (element_type *)local_128;
  local_120[8] = '\0';
  local_120._0_8_ = local_70;
  local_110._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_110._8_8_ = &local_138;
  local_140 = (char *)&local_130;
  local_100.m_message.px = (element_type *)((ulong)local_100.m_message.px & 0xffffffffffffff00);
  local_100._0_8_ = local_78;
  local_100.m_message.pn.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_e8 = &local_140;
  boost::test_tools::tt_detail::report_assertion
            (&local_d8,(lazy_ostream *)local_c0,&local_98,0xad,CHECK,CHECK_EQUAL,2,
             "a[0].longValue()",(lazy_ostream *)local_120,"400ll",&local_100);
  boost::detail::shared_count::~shared_count(&local_d8.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1c39f0,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1a23dd);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0xae;
  local_c0._8_8_ = local_c0._8_8_ & 0xffffffffffffff00;
  local_c0._0_8_ = local_e0;
  local_b0 = &boost::unit_test::lazy_ostream::inst;
  local_a8 = "";
  local_128._0_4_ = *(int *)(*(long *)peVar2 + 0x10);
  local_d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(*(int *)(*(long *)peVar2 + 0x10) == 4);
  local_130 = CONCAT44(local_130._4_4_,4);
  local_d8.m_message.px = (element_type *)0x0;
  local_d8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_98.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
  ;
  local_98.m_end = "";
  local_138 = (element_type *)local_128;
  local_120[8] = '\0';
  local_120._0_8_ = local_a0;
  local_110._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_110._8_8_ = &local_138;
  local_140 = (char *)&local_130;
  local_100.m_message.px = (element_type *)((ulong)local_100.m_message.px & 0xffffffffffffff00);
  local_100._0_8_ = local_a0;
  local_100.m_message.pn.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_e8 = &local_140;
  boost::test_tools::tt_detail::report_assertion
            (&local_d8,(lazy_ostream *)local_c0,&local_98,0xae,CHECK,CHECK_EQUAL,2,"a[1].type()",
             (lazy_ostream *)local_120,"etString",&local_100);
  boost::detail::shared_count::~shared_count(&local_d8.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1c39f0,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1a23dd);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0xaf;
  local_c0._8_8_ = local_c0._8_8_ & 0xffffffffffffff00;
  local_c0._0_8_ = local_e0;
  local_b0 = &boost::unit_test::lazy_ostream::inst;
  local_a8 = "";
  lVar1 = *(long *)peVar2;
  avro::json::Entity::ensureType((int)lVar1 + 0x10);
  psVar9 = boost::any_cast<boost::shared_ptr<std::__cxx11::string>>((any *)(lVar1 + 0x18));
  peVar3 = psVar9->px;
  iVar4 = std::__cxx11::string::compare((char *)peVar3);
  local_d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar4 == 0);
  local_d8.m_message.px = (element_type *)0x0;
  local_d8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_98.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
  ;
  local_98.m_end = "";
  local_120[8] = '\0';
  local_120._0_8_ = &PTR__lazy_ostream_001bff38;
  local_110._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_110._8_8_ = &local_138;
  local_140 = "v0";
  local_100.m_message.px = (element_type *)((ulong)local_100.m_message.px & 0xffffffffffffff00);
  local_100._0_8_ = &PTR__lazy_ostream_001bffb8;
  local_100.m_message.pn.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_e8 = &local_140;
  local_138 = peVar3;
  boost::test_tools::tt_detail::report_assertion
            (&local_d8,(lazy_ostream *)local_c0,&local_98,0xaf,CHECK,CHECK_EQUAL,2,
             "a[1].stringValue()",(lazy_ostream *)local_120,"\"v0\"",&local_100);
  boost::detail::shared_count::~shared_count(&local_d8.m_message.pn);
  if (local_80.content != (placeholder *)0x0) {
    (**(code **)(*(long *)local_80.content + 8))();
  }
  return;
}

Assistant:

static void testObject2()
{
    Entity n = loadEntity("{\"k1\": 100, \"k2\": [400, \"v0\"]}");
    BOOST_CHECK_EQUAL(n.type(), etObject);
    const Object& m = n.objectValue();
    BOOST_CHECK_EQUAL(m.size(), 2);

    Object::const_iterator it = m.find("k1");
    BOOST_CHECK(it != m.end());
    BOOST_CHECK_EQUAL(it->second.type(), etLong);
    BOOST_CHECK_EQUAL(m.begin()->second.longValue(), 100ll);

    it = m.find("k2");
    BOOST_CHECK(it != m.end());
    BOOST_CHECK_EQUAL(it->second.type(), etArray);
    const Array& a = it->second.arrayValue();
    BOOST_CHECK_EQUAL(a.size(), 2);
    BOOST_CHECK_EQUAL(a[0].type(), etLong);
    BOOST_CHECK_EQUAL(a[0].longValue(), 400ll);
    BOOST_CHECK_EQUAL(a[1].type(), etString);
    BOOST_CHECK_EQUAL(a[1].stringValue(), "v0");
}